

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool ON_MeshTriangle_GetTriangleNormal(double *p,double *q,double *r,ON_3dVector *triangle_normal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  bool bVar13;
  double b [3];
  double a [3];
  ON_3dVector *triangle_normal_local;
  double *r_local;
  double *q_local;
  double *p_local;
  
  dVar1 = *r;
  dVar2 = *p;
  dVar3 = r[1];
  dVar4 = p[1];
  dVar5 = r[2];
  dVar6 = p[2];
  dVar7 = *p;
  dVar8 = *q;
  dVar9 = p[1];
  dVar10 = q[1];
  dVar11 = p[2];
  dVar12 = q[2];
  triangle_normal->x = (dVar3 - dVar4) * (dVar11 - dVar12) + -((dVar9 - dVar10) * (dVar5 - dVar6));
  triangle_normal->y = (dVar5 - dVar6) * (dVar7 - dVar8) + -((dVar11 - dVar12) * (dVar1 - dVar2));
  triangle_normal->z = (dVar1 - dVar2) * (dVar9 - dVar10) + -((dVar7 - dVar8) * (dVar3 - dVar4));
  bVar13 = ON_3dVector::Unitize(triangle_normal);
  return bVar13;
}

Assistant:

static bool ON_MeshTriangle_GetTriangleNormal(
   const double* p,
   const double* q,
   const double* r,
   class ON_3dVector& triangle_normal
  )
{
  const double a[3] = {r[0]-p[0],r[1]-p[1],r[2]-p[2]};
  const double b[3] = {p[0]-q[0],p[1]-q[1],p[2]-q[2]};

  triangle_normal.x = a[1]*b[2] - b[1]*a[2];
  triangle_normal.y = a[2]*b[0] - b[2]*a[0];
  triangle_normal.z = a[0]*b[1] - b[0]*a[1];
  return triangle_normal.Unitize();
}